

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O1

CTcPrsNode * CTcPrsOpUnary::parse_postfix(int allow_member_expr,int allow_call_expr)

{
  tc_toktyp_t tVar1;
  CTcPrsNode *lhs;
  CTcPrsNode *unaff_R15;
  bool bVar2;
  
  lhs = parse_primary();
  if (lhs == (CTcPrsNode *)0x0) {
    unaff_R15 = (CTcPrsNode *)0x0;
  }
  else {
    do {
      tVar1 = (G_tok->curtok_).typ_;
      if ((int)tVar1 < 0x19) {
        if (tVar1 == TOKT_LPAR) {
          if (allow_call_expr == 0) goto LAB_00233d33;
          lhs = parse_call(lhs);
          goto LAB_00233d22;
        }
        if ((tVar1 == TOKT_DOT) && (allow_member_expr != 0)) {
          lhs = parse_member(lhs);
          goto LAB_00233d22;
        }
LAB_00233d33:
        bVar2 = false;
        unaff_R15 = lhs;
      }
      else {
        if (tVar1 == TOKT_LBRACK) {
          lhs = parse_subscript(lhs);
        }
        else if (tVar1 == TOKT_INC) {
          CTcTokenizer::next(G_tok);
          lhs = parse_inc(0,lhs);
        }
        else {
          if (tVar1 != TOKT_DEC) goto LAB_00233d33;
          CTcTokenizer::next(G_tok);
          lhs = parse_dec(0,lhs);
        }
LAB_00233d22:
        bVar2 = lhs != (CTcPrsNode *)0x0;
        if (!bVar2) {
          unaff_R15 = lhs;
        }
      }
    } while (bVar2);
  }
  return unaff_R15;
}

Assistant:

CTcPrsNode *CTcPrsOpUnary::parse_postfix(int allow_member_expr,
                                         int allow_call_expr)
{
    /* parse a primary expression */
    CTcPrsNode *sub = parse_primary();
    if (sub == 0)
        return 0;

    /* keep going as long as we find postfix operators */
    for (;;)
    {
        /* check for a postfix operator */
        tc_toktyp_t op = G_tok->cur();
        switch(op)
        {
        case TOKT_LPAR:
            /* left paren - function or method call */
            if (allow_call_expr)
            {
                /* parse the function call expression */
                sub = parse_call(sub);
            }
            else
            {
                /* call expressions aren't allowed - stop here */
                return sub;
            }
            break;

        case TOKT_LBRACK:
            /* left square bracket - subscript */
            sub = parse_subscript(sub);
            break;

        case TOKT_DOT:
            /* 
             *   Dot - member selection.  If a member expression is allowed
             *   by the caller, parse it; otherwise, just return the
             *   expression up to this point.  
             */
            if (allow_member_expr)
            {
                /* 
                 *   it's allowed - parse it and continue to look for other
                 *   postfix expressions following the member expression 
                 */
                sub = parse_member(sub);
            }
            else
            {
                /* 
                 *   member expressions aren't allowed - stop here,
                 *   returning the expression up to this point 
                 */
                return sub;
            }
            break;

        case TOKT_INC:
            /* post-increment */
            G_tok->next();
            sub = parse_inc(FALSE, sub);
            break;

        case TOKT_DEC:
            /* post-decrement */
            G_tok->next();
            sub = parse_dec(FALSE, sub);
            break;
            
        default:
            /* it's not a postfix operator - return the result */
            return sub;
        }

        /* if the last parse failed, return failure */
        if (sub == 0)
            return 0;
    }
}